

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall ACSStringPool::AddString(ACSStringPool *this,char *str)

{
  DWORD h_00;
  size_t len_00;
  FString local_40;
  FString fstr;
  int i;
  uint bucketnum;
  uint h;
  size_t len;
  char *str_local;
  ACSStringPool *this_local;
  
  len = (size_t)str;
  if (str == (char *)0x0) {
    len = (long)"\x01" + 1;
  }
  len_00 = strlen((char *)len);
  h_00 = SuperFastHash((char *)len,len_00);
  fstr.Chars._4_4_ = FindString(this,(char *)len,len_00,h_00,h_00 % 0xfb);
  if ((int)fstr.Chars._4_4_ < 0) {
    FString::FString(&local_40,(char *)len);
    this_local._4_4_ = InsertString(this,&local_40,h_00,h_00 % 0xfb);
    FString::~FString(&local_40);
  }
  else {
    this_local._4_4_ = fstr.Chars._4_4_ | 0x7ff00000;
  }
  return this_local._4_4_;
}

Assistant:

int ACSStringPool::AddString(const char *str)
{
	if (str == nullptr) str = "";
	size_t len = strlen(str);
	unsigned int h = SuperFastHash(str, len);
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, len, h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	FString fstr(str);
	return InsertString(fstr, h, bucketnum);
}